

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

XMLElement * __thiscall
tinyxml2::XMLDocument::CreateUnlinkedNode<tinyxml2::XMLElement,120>
          (XMLDocument *this,MemPoolT<120> *pool)

{
  int iVar1;
  undefined4 extraout_var;
  XMLElement *returnNode;
  MemPoolT<120> *pool_local;
  XMLDocument *this_local;
  XMLElement *this_00;
  
  iVar1 = (*(pool->super_MemPool)._vptr_MemPool[3])();
  this_00 = (XMLElement *)CONCAT44(extraout_var,iVar1);
  XMLElement::XMLElement(this_00,this);
  (this_00->super_XMLNode)._memPool = &pool->super_MemPool;
  DynArray<tinyxml2::XMLNode_*,_10>::Push(&this->_unlinked,(XMLNode *)this_00);
  return this_00;
}

Assistant:

inline NodeType* XMLDocument::CreateUnlinkedNode(MemPoolT<PoolElementSize>& pool)
{
    TIXMLASSERT(sizeof(NodeType) == PoolElementSize);
    TIXMLASSERT(sizeof(NodeType) == pool.ItemSize());
    NodeType* returnNode = new (pool.Alloc()) NodeType(this);
    TIXMLASSERT(returnNode);
    returnNode->_memPool = &pool;

    _unlinked.Push(returnNode);
    return returnNode;
}